

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void reverse_data(float *data,int datalen)

{
  float fVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  if (1 < datalen) {
    lVar4 = 0;
    lVar3 = (ulong)(uint)datalen - 2;
    do {
      fVar1 = data[lVar4];
      data[lVar4] = data[lVar3 + 1];
      data[lVar3 + 1] = fVar1;
      lVar4 = lVar4 + 1;
      bVar2 = lVar4 < lVar3;
      lVar3 = lVar3 + -1;
    } while (bVar2);
  }
  return;
}

Assistant:

void
reverse_data (float *data, int datalen)
{	int left, right ;
	float temp ;

	left = 0 ;
	right = datalen - 1 ;

	while (left < right)
	{	temp = data [left] ;
		data [left] = data [right] ;
		data [right] = temp ;
		left ++ ;
		right -- ;
		} ;

}